

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

Node __thiscall trieste::NodeDef::pop_back(NodeDef *this)

{
  pointer psVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  NodeDef *in_RSI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Node NVar3;
  
  psVar1 = *(pointer *)
            ((long)&(in_RSI->children).
                    super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                    ._M_impl + 8);
  if ((in_RSI->children).
      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar1) {
    (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
    super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00159d56;
  }
  (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       psVar1[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = psVar1[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
  super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = this_00;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(pointer *)
     ((long)&(in_RSI->children).
             super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
             ._M_impl + 8) = psVar1 + -1;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      psVar1 = *(pointer *)
                ((long)&(in_RSI->children).
                        super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                        ._M_impl + 8);
      this_00 = psVar1[-1].super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      *(pointer *)
       ((long)&(in_RSI->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl + 8) = psVar1 + -1;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00159d45;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      *(pointer *)
       ((long)&(in_RSI->children).
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               ._M_impl + 8) = psVar1 + -1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    in_RDX._M_pi = extraout_RDX;
  }
LAB_00159d45:
  peVar2 = (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
           super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->parent_ == in_RSI) {
    peVar2->parent_ = (NodeDef *)0x0;
  }
LAB_00159d56:
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Node)NVar3.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pop_back()
    {
      if (children.empty())
        return {};

      auto node = children.back();
      children.pop_back();

      if (node->parent_ == this)
        node->parent_ = nullptr;

      return node;
    }